

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool nakagami_check(double param_1,double b,double c)

{
  double c_local;
  double b_local;
  double param_0_local;
  
  if (0.0 < b) {
    if (0.0 < c) {
      param_0_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cout," \n");
      std::operator<<((ostream *)&std::cout,"NAKAGAMI_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cout,"  C <= 0.\n");
      param_0_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"NAKAGAMI_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  B <= 0.\n");
    param_0_local._7_1_ = false;
  }
  return param_0_local._7_1_;
}

Assistant:

bool nakagami_check ( double /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    NAKAGAMI_CHECK checks the parameters of the Nakagami PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, bool NAKAGAMI_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "NAKAGAMI_CHECK - Warning!\n";
    cout << "  B <= 0.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cout << " \n";
    cout << "NAKAGAMI_CHECK - Warning!\n";
    cout << "  C <= 0.\n";
    return false;
  }

  return true;
}